

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BooPHF.h
# Opt level: O1

bitVector * __thiscall boomphf::bitVector::operator=(bitVector *this,bitVector *r)

{
  if (r != this) {
    if (this->_bitArray != (uint64_t *)0x0) {
      free(this->_bitArray);
    }
    this->_size = r->_size;
    this->_nchar = r->_nchar;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
              (&this->_ranks,&r->_ranks);
    this->_bitArray = r->_bitArray;
    r->_bitArray = (uint64_t *)0x0;
  }
  return this;
}

Assistant:

bitVector &operator=(bitVector &&r)
		{
			//printf("bitVector move assignment \n");
			if (&r != this)
			{
				if(_bitArray != nullptr)
					free(_bitArray);
				
				_size =  std::move (r._size);
				_nchar = std::move (r._nchar);
				_ranks = std::move (r._ranks);
				_bitArray = r._bitArray;
				r._bitArray = nullptr;
			}
			return *this;
		}